

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O1

pair<unsigned_int,_const_dg::vr::AllocatedArea_*> __thiscall
dg::vr::StructureAnalyzer::getEqualArea(StructureAnalyzer *this,ValueRelations *graph,Value *ptr)

{
  ulong uVar1;
  pointer ppVVar2;
  AllocatedArea *area;
  AllocatedArea *pAVar3;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar4;
  VectorSet<const_llvm::Value_*> local_28;
  
  ValueRelations::getEqual(&local_28,graph,ptr);
  if (local_28.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_28.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppVVar2 = local_28.vec.
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (*(AllocatedArea **)(this + 0xb8) != *(AllocatedArea **)(this + 0xc0)) {
        uVar1 = 0;
        pAVar3 = *(AllocatedArea **)(this + 0xb8);
        do {
          if (pAVar3->ptr == *ppVVar2) goto LAB_00127130;
          uVar1 = (ulong)((int)uVar1 + 1);
          pAVar3 = pAVar3 + 1;
        } while (pAVar3 != *(AllocatedArea **)(this + 0xc0));
      }
      uVar1 = 0;
      pAVar3 = (AllocatedArea *)0x0;
LAB_00127130:
      if (pAVar3 != (AllocatedArea *)0x0) {
        if (local_28.vec.
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_28.vec.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_28.vec.
                                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_28.vec.
                                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_00127169;
      }
      ppVVar2 = ppVVar2 + 1;
    } while (ppVVar2 !=
             local_28.vec.
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_28.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.vec.
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.vec.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.vec.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar1 = 0;
  pAVar3 = (AllocatedArea *)0x0;
LAB_00127169:
  pVar4.second = pAVar3;
  pVar4._0_8_ = uVar1;
  return pVar4;
}

Assistant:

std::pair<unsigned, const AllocatedArea *>
StructureAnalyzer::getEqualArea(const ValueRelations &graph,
                                const llvm::Value *ptr) const {
    unsigned index = 0;
    const AllocatedArea *area = nullptr;
    for (const auto *equal : graph.getEqual(ptr)) {
        std::tie(index, area) = getAllocatedAreaFor(equal);
        if (area)
            return {index, area};
    }
    return {0, nullptr};
}